

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::SocketTest_UdpSocketHello_Test::~SocketTest_UdpSocketHello_Test
          (SocketTest_UdpSocketHello_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SocketTest, UdpSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    UdpSocket serverSocket{eventBase};
    serverSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

        if (aFlags & EV_READ)
        {
            len = serverSocket.Receive(buf, sizeof(buf));
            EXPECT_GT(len, 0);
            EXPECT_EQ((ByteArray{buf, buf + len}), kHello);

            len = serverSocket.Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    EXPECT_EQ(serverSocket.Bind(kServerAddr, kServerPort), 0);
    EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

    UdpSocket clientSocket{eventBase};
    clientSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        if (aFlags & EV_READ)
        {
            len = clientSocket.Receive(buf, sizeof(buf));
            EXPECT_EQ((ByteArray{buf, buf + len}), kWorld);

            event_base_loopbreak(eventBase);
        }
    });

    EXPECT_EQ(clientSocket.Connect(kServerAddr, kServerPort), 0);
    EXPECT_EQ(clientSocket.GetPeerPort(), kServerPort);
    EXPECT_EQ(clientSocket.Send(&kHello[0], kHello.size()), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}